

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_writeKeyValuePair
                 (qpTestLog *log,char *elementName,char *name,char *description,char *unit,
                 qpKeyValueTag tag,char *text)

{
  char *pcVar1;
  uint uVar2;
  deBool dVar3;
  uint uVar4;
  ulong uVar5;
  deBool dVar6;
  bool bVar7;
  qpXmlAttribute local_138 [8];
  
  pcVar1 = s_qpTagMap[(int)tag].string;
  deMutex_lock(log->lock);
  bVar7 = name != (char *)0x0;
  if (bVar7) {
    local_138[0].name = "Name";
    local_138[0].type = QP_XML_ATTRIBUTE_STRING;
    local_138[0].intValue = -0x2a6;
    local_138[0].boolValue = -1;
    local_138[0].stringValue = name;
  }
  uVar2 = (uint)bVar7;
  if (description != (char *)0x0) {
    uVar2 = uVar2 + 1;
    local_138[bVar7].name = "Description";
    local_138[bVar7].type = QP_XML_ATTRIBUTE_STRING;
    local_138[bVar7].stringValue = description;
    local_138[bVar7].intValue = -0x2a6;
    local_138[bVar7].boolValue = -1;
  }
  uVar4 = uVar2;
  if (pcVar1 != (char *)0x0) {
    uVar4 = uVar2 + 1;
    uVar5 = (ulong)(uVar2 << 5);
    *(char **)((long)&local_138[0].name + uVar5) = "Tag";
    *(undefined4 *)((long)&local_138[0].type + uVar5) = 0;
    *(char **)((long)&local_138[0].stringValue + uVar5) = pcVar1;
    *(undefined8 *)((long)&local_138[0].intValue + uVar5) = 0xfffffffffffffd5a;
  }
  uVar2 = uVar4;
  if (unit != (char *)0x0) {
    uVar2 = uVar4 + 1;
    uVar5 = (ulong)(uVar4 << 5);
    *(char **)((long)&local_138[0].name + uVar5) = "Unit";
    *(undefined4 *)((long)&local_138[0].type + uVar5) = 0;
    *(char **)((long)&local_138[0].stringValue + uVar5) = unit;
    *(undefined8 *)((long)&local_138[0].intValue + uVar5) = 0xfffffffffffffd5a;
  }
  dVar3 = qpXmlWriter_startElement(log->writer,elementName,uVar2,local_138);
  if ((dVar3 != 0) && (dVar3 = qpXmlWriter_writeString(log->writer,text), dVar3 != 0)) {
    dVar3 = qpXmlWriter_endElement(log->writer,elementName);
    dVar6 = 1;
    if (dVar3 != 0) goto LAB_0033f604;
  }
  dVar6 = 0;
  qpPrintf("qpTestLog_writeKeyValuePair(): Writing XML failed\n");
LAB_0033f604:
  deMutex_unlock(log->lock);
  return dVar6;
}

Assistant:

static deBool qpTestLog_writeKeyValuePair (qpTestLog* log, const char* elementName, const char* name, const char* description, const char* unit, qpKeyValueTag tag, const char* text)
{
	const char*		tagString = QP_LOOKUP_STRING(s_qpTagMap, tag);
	qpXmlAttribute	attribs[8];
	int				numAttribs = 0;

	DE_ASSERT(log && elementName && text);
	deMutex_lock(log->lock);

	/* Fill in attributes. */
	if (name)			attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	if (description)	attribs[numAttribs++] = qpSetStringAttrib("Description", description);
	if (tagString)		attribs[numAttribs++] = qpSetStringAttrib("Tag", tagString);
	if (unit)			attribs[numAttribs++] = qpSetStringAttrib("Unit", unit);

	if (!qpXmlWriter_startElement(log->writer, elementName, numAttribs, attribs) ||
		!qpXmlWriter_writeString(log->writer, text) ||
		!qpXmlWriter_endElement(log->writer, elementName))
	{
		qpPrintf("qpTestLog_writeKeyValuePair(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}